

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * phosg::escape_controls(string *__return_storage_ptr__,string *s,bool escape_non_ascii)

{
  char __c;
  char *__s;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = 0;
  do {
    if (s->_M_string_length <= uVar1) {
      return __return_storage_ptr__;
    }
    __c = (s->_M_dataplus)._M_p[uVar1];
    switch(__c) {
    case '\a':
      __s = "\\a";
      break;
    case '\b':
      __s = "\\b";
      break;
    case '\t':
      __s = "\\t";
      break;
    case '\n':
      __s = "\\n";
      break;
    case '\v':
      __s = "\\v";
      break;
    case '\f':
      __s = "\\f";
      break;
    case '\r':
      __s = "\\r";
      break;
    default:
      if (__c == '\\') {
        __s = "\\\\";
        break;
      }
      __s = "\\\'";
      if (__c == '\'') break;
      if (__c == '\"') {
        __s = "\\\"";
        break;
      }
      if (escape_non_ascii) {
        if ((byte)(__c + 0x81U) < 0xa1) goto LAB_0010b476;
LAB_0010b425:
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      else {
        if (0xa0 < (byte)(__c + 0x81U) || __c < '\0') goto LAB_0010b425;
LAB_0010b476:
        string_printf_abi_cxx11_(&local_50,"\\x%02X");
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      goto LAB_0010b45c;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,__s);
LAB_0010b45c:
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

string escape_controls(const string& s, bool escape_non_ascii) {
  string ret;
  for (size_t x = 0; x < s.size(); x++) {
    char ch = s[x];
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch == '\'') {
      ret += "\\\'";
    } else if (ch == '\\') {
      ret += "\\\\";
    } else if (ch == '\t') {
      ret += "\\t";
    } else if (ch == '\r') {
      ret += "\\r";
    } else if (ch == '\n') {
      ret += "\\n";
    } else if (ch == '\f') {
      ret += "\\f";
    } else if (ch == '\b') {
      ret += "\\b";
    } else if (ch == '\a') {
      ret += "\\a";
    } else if (ch == '\v') {
      ret += "\\v";
    } else if (escape_non_ascii ? (ch < 0x20 || ch > 0x7E) : (!(ch & 0x80) && ((ch < 0x20) || ch == 0x7F))) {
      ret += string_printf("\\x%02X", static_cast<uint8_t>(ch));
    } else {
      ret += ch;
    }
  }
  return ret;
}